

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

MeasuredBxDFData * pbrt::MeasuredBxDFData::Create(string *filename,Allocator alloc)

{
  value_type vVar1;
  value_type vVar2;
  ulong uVar3;
  initializer_list<int> v;
  initializer_list<const_float_*> v_00;
  initializer_list<int> v_01;
  initializer_list<const_float_*> v_02;
  initializer_list<int> v_03;
  initializer_list<const_float_*> v_04;
  array<const_float_*,_2> aVar4;
  array<const_float_*,_2> aVar5;
  Field *pFVar6;
  size_type sVar7;
  const_reference pvVar8;
  float *pfVar9;
  pointer puVar10;
  reference pvVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  undefined8 in_RSI;
  string *in_RDI;
  long *in_FS_OFFSET;
  double dVar17;
  undefined1 auVar18 [16];
  size_t i;
  size_t size;
  int reduction;
  float *phi_i_data;
  MeasuredBxDFData *brdf;
  Field *jacobian;
  Field *description;
  Field *wavelengths;
  Field *luminance;
  Field *spectra;
  Field *vndf;
  Field *sigma;
  Field *ndf;
  Field *phi_i;
  Field *theta_i;
  Tensor tf;
  undefined8 in_stack_fffffffffffff6e8;
  uint uVar20;
  PiecewiseLinear2D<0UL> *pPVar19;
  PiecewiseLinear2D<3UL> *in_stack_fffffffffffff6f0;
  PiecewiseLinear2D<2UL> *this;
  string *in_stack_fffffffffffff6f8;
  Tensor *in_stack_fffffffffffff700;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffff714;
  size_type in_stack_fffffffffffff718;
  Tensor *in_stack_fffffffffffff720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff730;
  string *in_stack_fffffffffffff8c8;
  Tensor *in_stack_fffffffffffff8d0;
  pointer local_708;
  pointer local_700;
  pointer local_6f8;
  pointer *local_6f0;
  undefined8 local_6e8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 *local_6b8;
  undefined8 local_6b0;
  PiecewiseLinear2D<3UL> *local_6a8;
  undefined4 local_6a0;
  undefined8 local_698;
  undefined1 in_stack_fffffffffffff98e;
  undefined1 in_stack_fffffffffffff98f;
  int in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  undefined2 uVar22;
  int in_stack_fffffffffffff998;
  int in_stack_fffffffffffff99c;
  PiecewiseLinear2D<2UL> *in_stack_fffffffffffff9a0;
  array<int,_2> in_stack_fffffffffffff9a8;
  Allocator in_stack_fffffffffffff9b0;
  array<int,_3> in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9cc;
  array<const_float_*,_3> in_stack_fffffffffffff9d0;
  ulong local_5e0;
  pointer local_5d0;
  pointer local_5c8;
  pointer *local_5c0;
  undefined8 local_5b8;
  PiecewiseLinear2D<2UL> *local_5b0;
  PiecewiseLinear2D<2UL> *pPStack_5a8;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 *local_598;
  undefined8 local_590;
  undefined8 local_580;
  pointer local_4d0;
  pointer local_4c8;
  pointer *local_4c0;
  undefined8 local_4b8;
  PiecewiseLinear2D<2UL> *local_4b0;
  PiecewiseLinear2D<2UL> *pPStack_4a8;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 *local_498;
  undefined8 local_490;
  undefined8 local_480;
  undefined8 local_3c8;
  PiecewiseLinear2D<0UL> local_3c0;
  undefined8 local_320;
  PiecewiseLinear2D<0UL> local_318;
  int local_27c;
  float *local_278;
  MeasuredBxDFData *local_270;
  undefined4 local_268;
  allocator<char> local_261;
  string local_260 [32];
  Field *local_240;
  allocator<char> local_231;
  string local_230 [32];
  Field *local_210;
  allocator<char> local_201;
  string local_200 [32];
  Field *local_1e0;
  allocator<char> local_1d1;
  string local_1d0 [32];
  Field *local_1b0;
  allocator<char> local_1a1;
  string local_1a0 [32];
  Field *local_180;
  allocator<char> local_171;
  string local_170 [32];
  Field *local_150;
  allocator<char> local_141;
  string local_140 [32];
  Field *local_120;
  allocator<char> local_111;
  string local_110 [32];
  Field *local_f0;
  allocator<char> local_e1;
  string local_e0 [32];
  Field *local_c0;
  allocator<char> local_a1;
  string local_a0 [32];
  Field *local_80;
  string *local_18;
  undefined8 local_10;
  MeasuredBxDFData *local_8;
  
  uVar20 = (uint)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
  local_18 = in_RDI;
  local_10 = in_RSI;
  Tensor::Tensor(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  local_c0 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  local_f0 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  local_120 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_150 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  local_180 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  local_1b0 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  local_1e0 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  local_210 = pFVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff730,(char *)in_stack_fffffffffffff728,
             (allocator<char> *)in_stack_fffffffffffff720);
  pFVar6 = Tensor::field(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  local_240 = pFVar6;
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_210->shape);
  if ((sVar7 == 1) && (local_210->dtype == UInt8)) {
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_80->shape);
    if ((sVar7 == 1) && (local_80->dtype == Float32)) {
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_c0->shape);
      if ((sVar7 == 1) && (local_c0->dtype == Float32)) {
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_1e0->shape);
        if ((sVar7 == 1) && (local_1e0->dtype == Float32)) {
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_f0->shape)
          ;
          if ((sVar7 == 2) && (local_f0->dtype == Float32)) {
            sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              (&local_120->shape);
            if ((sVar7 == 2) && (local_120->dtype == Float32)) {
              sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                (&local_150->shape);
              if ((sVar7 == 4) && (local_150->dtype == Float32)) {
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_150->shape,0);
                vVar2 = *pvVar8;
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_c0->shape,0);
                if (vVar2 == *pvVar8) {
                  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (&local_150->shape,1);
                  vVar2 = *pvVar8;
                  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (&local_80->shape,0);
                  if (vVar2 == *pvVar8) {
                    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                      (&local_1b0->shape);
                    if ((sVar7 == 4) && (local_1b0->dtype == Float32)) {
                      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                               operator[](&local_1b0->shape,0);
                      vVar2 = *pvVar8;
                      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                               operator[](&local_c0->shape,0);
                      if (vVar2 == *pvVar8) {
                        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                 operator[](&local_1b0->shape,1);
                        vVar2 = *pvVar8;
                        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                 operator[](&local_80->shape,0);
                        if (vVar2 == *pvVar8) {
                          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                   operator[](&local_1b0->shape,2);
                          vVar2 = *pvVar8;
                          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                   operator[](&local_1b0->shape,3);
                          if ((vVar2 == *pvVar8) && (local_180->dtype == Float32)) {
                            sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                              (&local_180->shape);
                            if (sVar7 == 5) {
                              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                       operator[](&local_180->shape,0);
                              vVar2 = *pvVar8;
                              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                       operator[](&local_c0->shape,0);
                              if (vVar2 == *pvVar8) {
                                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                         ::operator[](&local_180->shape,1);
                                vVar2 = *pvVar8;
                                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                         ::operator[](&local_80->shape,0);
                                if (vVar2 == *pvVar8) {
                                  pvVar8 = std::
                                           vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                           operator[](&local_180->shape,2);
                                  vVar2 = *pvVar8;
                                  pvVar8 = std::
                                           vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                           operator[](&local_1e0->shape,0);
                                  if (vVar2 == *pvVar8) {
                                    pvVar8 = std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             operator[](&local_180->shape,3);
                                    vVar2 = *pvVar8;
                                    pvVar8 = std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             operator[](&local_180->shape,4);
                                    if (vVar2 == *pvVar8) {
                                      pvVar8 = std::
                                               vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               ::operator[](&local_1b0->shape,2);
                                      vVar2 = *pvVar8;
                                      pvVar8 = std::
                                               vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               ::operator[](&local_180->shape,3);
                                      if (vVar2 == *pvVar8) {
                                        pvVar8 = std::
                                                 vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ::operator[](&local_1b0->shape,3);
                                        vVar2 = *pvVar8;
                                        pvVar8 = std::
                                                 vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ::operator[](&local_180->shape,4);
                                        if (vVar2 == *pvVar8) {
                                          sVar7 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::size(&local_240->shape);
                                          if (sVar7 == 1) {
                                            pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_240->shape,0);
                                            if ((*pvVar8 == 1) && (local_240->dtype == UInt8)) {
                                              local_270 = pstd::pmr::
                                                          polymorphic_allocator<std::byte>::
                                                                                                                    
                                                  new_object<pbrt::MeasuredBxDFData,pstd::pmr::polymorphic_allocator<std::byte>&>
                                                            ((polymorphic_allocator<std::byte> *)
                                                             in_stack_fffffffffffff700,
                                                             (polymorphic_allocator<std::byte> *)
                                                             in_stack_fffffffffffff6f8);
                                              std::__cxx11::string::operator=
                                                        ((string *)&local_270->filename,local_18);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_c0->shape,0);
                                              local_270->isotropic = *pvVar8 < 3;
                                              if ((local_270->isotropic & 1U) == 0) {
                                                pfVar9 = (float *)std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)in_stack_fffffffffffff6f0);
                                                local_278 = pfVar9;
                                                pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_c0->shape,0);
                                                auVar18._0_4_ =
                                                     6.2831855 / (pfVar9[*pvVar8 - 1] - *local_278);
                                                auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                                dVar17 = std::rint(auVar18._0_8_);
                                                local_27c = (int)SUB84(dVar17,0);
                                                if (local_27c != 1) {
                                                  ErrorExit<std::__cxx11::string_const&,int&>
                                                            ((char *)in_stack_fffffffffffff730,
                                                             in_stack_fffffffffffff728,
                                                             (int *)in_stack_fffffffffffff720);
                                                }
                                                local_27c = 1;
                                              }
                                              local_320 = local_10;
                                              puVar10 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)in_stack_fffffffffffff6f0);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_f0->shape,1);
                                              vVar2 = *pvVar8;
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_f0->shape,0);
                                              pPVar19 = (PiecewiseLinear2D<0UL> *)
                                                        ((ulong)uVar20 << 0x20);
                                              PiecewiseLinear2D<0UL>::PiecewiseLinear2D
                                                        (&local_318,local_320,puVar10,(int)vVar2,
                                                         (int)*pvVar8,0);
                                              PiecewiseLinear2D<0UL>::operator=
                                                        ((PiecewiseLinear2D<0UL> *)
                                                         in_stack_fffffffffffff6f0,pPVar19);
                                              PiecewiseLinear2D<0UL>::~PiecewiseLinear2D
                                                        ((PiecewiseLinear2D<0UL> *)
                                                         in_stack_fffffffffffff6f0);
                                              local_3c8 = local_10;
                                              puVar10 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)in_stack_fffffffffffff6f0);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_120->shape,1);
                                              vVar2 = *pvVar8;
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_120->shape,0);
                                              pPVar19 = (PiecewiseLinear2D<0UL> *)
                                                        ((ulong)pPVar19 & 0xffffffff00000000);
                                              PiecewiseLinear2D<0UL>::PiecewiseLinear2D
                                                        (&local_3c0,local_3c8,puVar10,(int)vVar2,
                                                         (int)*pvVar8,0);
                                              PiecewiseLinear2D<0UL>::operator=
                                                        ((PiecewiseLinear2D<0UL> *)
                                                         in_stack_fffffffffffff6f0,pPVar19);
                                              PiecewiseLinear2D<0UL>::~PiecewiseLinear2D
                                                        ((PiecewiseLinear2D<0UL> *)
                                                         in_stack_fffffffffffff6f0);
                                              local_480 = local_10;
                                              std::
                                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                              ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)in_stack_fffffffffffff6f0);
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::operator[](&local_150->shape,3);
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::operator[](&local_150->shape,2);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_c0->shape,0);
                                              local_4a0 = (undefined4)*pvVar8;
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_80->shape,0);
                                              local_49c = (undefined4)*pvVar8;
                                              local_498 = &local_4a0;
                                              local_490 = 2;
                                              v._M_len = (size_type)in_stack_fffffffffffff730;
                                              v._M_array = (iterator)in_stack_fffffffffffff728;
                                              pstd::array<int,_2>::array
                                                        ((array<int,_2> *)in_stack_fffffffffffff720,
                                                         v);
                                              local_4d0 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)in_stack_fffffffffffff6f0);
                                              local_4c8 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)in_stack_fffffffffffff6f0);
                                              local_4c0 = &local_4d0;
                                              local_4b8 = 2;
                                              v_00._M_len = (size_type)in_stack_fffffffffffff730;
                                              v_00._M_array = (iterator)in_stack_fffffffffffff728;
                                              pstd::array<const_float_*,_2>::array
                                                        ((array<const_float_*,_2> *)
                                                         in_stack_fffffffffffff720,v_00);
                                              aVar4.values[1]._4_4_ = in_stack_fffffffffffff9cc;
                                              aVar4.values._0_12_ = in_stack_fffffffffffff9c0.values
                                              ;
                                              PiecewiseLinear2D<2UL>::PiecewiseLinear2D
                                                        (in_stack_fffffffffffff9a0,
                                                         in_stack_fffffffffffff9b0,
                                                         (float *)CONCAT44(in_stack_fffffffffffff99c
                                                                           ,
                                                  in_stack_fffffffffffff998),
                                                  in_stack_fffffffffffff994,
                                                  in_stack_fffffffffffff990,
                                                  in_stack_fffffffffffff9a8,aVar4,
                                                  (bool)in_stack_fffffffffffff98f,
                                                  (bool)in_stack_fffffffffffff98e);
                                              PiecewiseLinear2D<2UL>::operator=
                                                        (pPStack_4a8,local_4b0);
                                              PiecewiseLinear2D<2UL>::~PiecewiseLinear2D
                                                        (pPStack_4a8);
                                              local_580 = local_10;
                                              std::
                                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                              ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)pPStack_4a8);
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::operator[](&local_1b0->shape,3);
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::operator[](&local_1b0->shape,2);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_c0->shape,0);
                                              local_5a0 = (undefined4)*pvVar8;
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_80->shape,0);
                                              local_59c = (undefined4)*pvVar8;
                                              local_598 = &local_5a0;
                                              local_590 = 2;
                                              v_01._M_len = (size_type)in_stack_fffffffffffff730;
                                              v_01._M_array = (iterator)in_stack_fffffffffffff728;
                                              pstd::array<int,_2>::array
                                                        ((array<int,_2> *)in_stack_fffffffffffff720,
                                                         v_01);
                                              local_5d0 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)pPStack_4a8);
                                              local_5c8 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)pPStack_4a8);
                                              local_5c0 = &local_5d0;
                                              local_5b8 = 2;
                                              v_02._M_len = (size_type)in_stack_fffffffffffff730;
                                              v_02._M_array = (iterator)in_stack_fffffffffffff728;
                                              pstd::array<const_float_*,_2>::array
                                                        ((array<const_float_*,_2> *)
                                                         in_stack_fffffffffffff720,v_02);
                                              aVar5.values[1]._4_4_ = in_stack_fffffffffffff9cc;
                                              aVar5.values._0_12_ = in_stack_fffffffffffff9c0.values
                                              ;
                                              PiecewiseLinear2D<2UL>::PiecewiseLinear2D
                                                        (in_stack_fffffffffffff9a0,
                                                         in_stack_fffffffffffff9b0,
                                                         (float *)CONCAT44(in_stack_fffffffffffff99c
                                                                           ,
                                                  in_stack_fffffffffffff998),
                                                  in_stack_fffffffffffff994,
                                                  in_stack_fffffffffffff990,
                                                  in_stack_fffffffffffff9a8,aVar5,
                                                  (bool)in_stack_fffffffffffff98f,
                                                  (bool)in_stack_fffffffffffff98e);
                                              PiecewiseLinear2D<2UL>::operator=
                                                        (pPStack_5a8,local_5b0);
                                              PiecewiseLinear2D<2UL>::~PiecewiseLinear2D
                                                        (pPStack_5a8);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_1e0->shape,0);
                                              uVar3 = *pvVar8;
                                              pstd::
                                              vector<float,_pstd::pmr::polymorphic_allocator<float>_>
                                              ::resize((
                                                  vector<float,_pstd::pmr::polymorphic_allocator<float>_>
                                                  *)in_stack_fffffffffffff720,
                                                  in_stack_fffffffffffff718);
                                              this = pPStack_5a8;
                                              for (local_5e0 = 0;
                                                  uVar22 = (undefined2)
                                                           ((uint)in_stack_fffffffffffff994 >> 0x10)
                                                  , local_5e0 < uVar3; local_5e0 = local_5e0 + 1) {
                                                puVar10 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)this);
                                                vVar1 = *(value_type *)(puVar10 + local_5e0 * 4);
                                                pvVar11 = pstd::
                                                  vector<float,_pstd::pmr::polymorphic_allocator<float>_>
                                                  ::operator[](&local_270->wavelengths,local_5e0);
                                                *pvVar11 = vVar1;
                                              }
                                              local_698 = local_10;
                                              std::
                                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                              ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)this);
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::operator[](&local_180->shape,4);
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::operator[](&local_180->shape,3);
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_c0->shape,0);
                                              local_6c4 = (undefined4)*pvVar8;
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_80->shape,0);
                                              local_6c0 = (undefined4)*pvVar8;
                                              pvVar8 = std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator[](&local_1e0->shape,0);
                                              local_6bc = (undefined4)*pvVar8;
                                              local_6b8 = &local_6c4;
                                              local_6b0 = 3;
                                              v_03._M_len = (size_type)in_stack_fffffffffffff730;
                                              v_03._M_array = (iterator)in_stack_fffffffffffff728;
                                              pstd::array<int,_3>::array
                                                        ((array<int,_3> *)in_stack_fffffffffffff720,
                                                         v_03);
                                              local_708 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)this);
                                              local_700 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)this);
                                              local_6f8 = std::
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  ::get((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)this);
                                              uVar21 = (undefined4)((ulong)this >> 0x20);
                                              local_6f0 = &local_708;
                                              local_6e8 = 3;
                                              v_04._M_len = (size_type)in_stack_fffffffffffff730;
                                              v_04._M_array = (iterator)in_stack_fffffffffffff728;
                                              pstd::array<const_float_*,_3>::array
                                                        ((array<const_float_*,_3> *)
                                                         in_stack_fffffffffffff720,v_04);
                                              in_stack_fffffffffffff6f0 =
                                                   (PiecewiseLinear2D<3UL> *)
                                                   CONCAT44(uVar21,local_6a0);
                                              uVar21 = 0;
                                              PiecewiseLinear2D<3UL>::PiecewiseLinear2D
                                                        ((PiecewiseLinear2D<3UL> *)
                                                         in_stack_fffffffffffff9a8.values,
                                                         in_stack_fffffffffffff9b0,
                                                         (float *)in_stack_fffffffffffff9a0,
                                                         in_stack_fffffffffffff99c,
                                                         in_stack_fffffffffffff998,
                                                         in_stack_fffffffffffff9c0,
                                                         in_stack_fffffffffffff9d0,
                                                         SUB21((ushort)uVar22 >> 8,0),
                                                         SUB21(uVar22,0));
                                              PiecewiseLinear2D<3UL>::operator=
                                                        (in_stack_fffffffffffff6f0,local_6a8);
                                              PiecewiseLinear2D<3UL>::~PiecewiseLinear2D
                                                        (in_stack_fffffffffffff6f0);
                                              sVar12 = pstd::
                                                  vector<float,_pstd::pmr::polymorphic_allocator<float>_>
                                                  ::size(&local_270->wavelengths);
                                              sVar13 = PiecewiseLinear2D<0UL>::BytesUsed
                                                                 ((PiecewiseLinear2D<0UL> *)
                                                                  CONCAT44(in_stack_fffffffffffff714
                                                                           ,uVar21));
                                              sVar14 = PiecewiseLinear2D<0UL>::BytesUsed
                                                                 ((PiecewiseLinear2D<0UL> *)
                                                                  CONCAT44(in_stack_fffffffffffff714
                                                                           ,uVar21));
                                              sVar15 = PiecewiseLinear2D<2UL>::BytesUsed
                                                                 ((PiecewiseLinear2D<2UL> *)
                                                                  CONCAT44(in_stack_fffffffffffff714
                                                                           ,uVar21));
                                              lVar16 = sVar12 * 4 + 0x378 + sVar13 + sVar14 + sVar15
                                              ;
                                              sVar12 = PiecewiseLinear2D<2UL>::BytesUsed
                                                                 ((PiecewiseLinear2D<2UL> *)
                                                                  CONCAT44(in_stack_fffffffffffff714
                                                                           ,uVar21));
                                              lVar16 = lVar16 + sVar12;
                                              sVar12 = PiecewiseLinear2D<3UL>::BytesUsed
                                                                 ((PiecewiseLinear2D<3UL> *)
                                                                  CONCAT44(in_stack_fffffffffffff714
                                                                           ,uVar21));
                                              *(long *)(*in_FS_OFFSET + -0x188) =
                                                   lVar16 + sVar12 +
                                                   *(long *)(*in_FS_OFFSET + -0x188);
                                              local_8 = local_270;
                                              goto LAB_0083cec8;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Error<std::__cxx11::string_const&,pbrt::Tensor&>
            ((char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,in_stack_fffffffffffff720);
  local_8 = (MeasuredBxDFData *)0x0;
LAB_0083cec8:
  local_268 = 1;
  Tensor::~Tensor((Tensor *)in_stack_fffffffffffff6f0);
  return local_8;
}

Assistant:

MeasuredBxDFData *MeasuredBxDFData::Create(const std::string &filename, Allocator alloc) {
    Tensor tf = Tensor(filename);
    auto &theta_i = tf.field("theta_i");
    auto &phi_i = tf.field("phi_i");
    auto &ndf = tf.field("ndf");
    auto &sigma = tf.field("sigma");
    auto &vndf = tf.field("vndf");
    auto &spectra = tf.field("spectra");
    auto &luminance = tf.field("luminance");
    auto &wavelengths = tf.field("wavelengths");
    auto &description = tf.field("description");
    auto &jacobian = tf.field("jacobian");

    if (!(description.shape.size() == 1 && description.dtype == Tensor::UInt8 &&

          theta_i.shape.size() == 1 && theta_i.dtype == Tensor::Float32 &&

          phi_i.shape.size() == 1 && phi_i.dtype == Tensor::Float32 &&

          wavelengths.shape.size() == 1 && wavelengths.dtype == Tensor::Float32 &&

          ndf.shape.size() == 2 && ndf.dtype == Tensor::Float32 &&

          sigma.shape.size() == 2 && sigma.dtype == Tensor::Float32 &&

          vndf.shape.size() == 4 && vndf.dtype == Tensor::Float32 &&
          vndf.shape[0] == phi_i.shape[0] && vndf.shape[1] == theta_i.shape[0] &&

          luminance.shape.size() == 4 && luminance.dtype == Tensor::Float32 &&
          luminance.shape[0] == phi_i.shape[0] &&
          luminance.shape[1] == theta_i.shape[0] &&
          luminance.shape[2] == luminance.shape[3] &&

          spectra.dtype == Tensor::Float32 && spectra.shape.size() == 5 &&
          spectra.shape[0] == phi_i.shape[0] && spectra.shape[1] == theta_i.shape[0] &&
          spectra.shape[2] == wavelengths.shape[0] &&
          spectra.shape[3] == spectra.shape[4] &&

          luminance.shape[2] == spectra.shape[3] &&
          luminance.shape[3] == spectra.shape[4] &&

          jacobian.shape.size() == 1 && jacobian.shape[0] == 1 &&
          jacobian.dtype == Tensor::UInt8)) {
        Error("%s: invalid BRDF file structure: %s", filename, tf);
        return nullptr;
    }

    MeasuredBxDFData *brdf = alloc.new_object<MeasuredBxDFData>(alloc);
    brdf->filename = filename;
    brdf->isotropic = phi_i.shape[0] <= 2;

    if (!brdf->isotropic) {
        float *phi_i_data = (float *)phi_i.data.get();
        int reduction =
            (int)std::rint((2 * Pi) / (phi_i_data[phi_i.shape[0] - 1] - phi_i_data[0]));
        if (reduction != 1)
            ErrorExit("%s: reduction %d (!= 1) not supported", filename, reduction);
    }

    /* Construct NDF interpolant data structure */
    brdf->ndf = PiecewiseLinear2D<0>(alloc, (float *)ndf.data.get(), ndf.shape[1],
                                     ndf.shape[0], {}, {}, false, false);

    /* Construct projected surface area interpolant data structure */
    brdf->sigma = PiecewiseLinear2D<0>(alloc, (float *)sigma.data.get(), sigma.shape[1],
                                       sigma.shape[0], {}, {}, false, false);

    /* Construct VNDF warp data structure */
    brdf->vndf = PiecewiseLinear2D<2>(
        alloc, (float *)vndf.data.get(), vndf.shape[3], vndf.shape[2],
        {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
        {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Construct Luminance warp data structure */
    brdf->luminance = PiecewiseLinear2D<2>(
        alloc, (float *)luminance.data.get(), luminance.shape[3], luminance.shape[2],
        {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
        {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Copy wavelength information */
    size_t size = wavelengths.shape[0];
    brdf->wavelengths.resize(size);
    for (size_t i = 0; i < size; ++i)
        brdf->wavelengths[i] = ((const float *)wavelengths.data.get())[i];

    /* Construct spectral interpolant */
    brdf->spectra = PiecewiseLinear2D<3>(
        alloc, (float *)spectra.data.get(), spectra.shape[4], spectra.shape[3],
        {{(int)phi_i.shape[0], (int)theta_i.shape[0], (int)wavelengths.shape[0]}},
        {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get(),
          (const float *)wavelengths.data.get()}},
        false, false);

    measuredBRDFBytes += sizeof(MeasuredBxDFData) + 4 * brdf->wavelengths.size() +
                         brdf->ndf.BytesUsed() + brdf->sigma.BytesUsed() +
                         brdf->vndf.BytesUsed() + brdf->luminance.BytesUsed() +
                         brdf->spectra.BytesUsed();

    return brdf;
}